

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O3

int fekete_degree(int rule)

{
  ostream *poVar1;
  
  if (rule - 1U < 7) {
    return *(int *)(&DAT_0022dc00 + (ulong)(rule - 1U) * 4);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<((ostream *)&std::cout,"FEKETE_DEGREE - Fatal error!\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"  Illegal RULE = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rule);
  std::operator<<(poVar1,"\n");
  exit(1);
}

Assistant:

int fekete_degree ( int rule )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_DEGREE returns the degree of a Fekete rule for the triangle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Output, int FEKETE_DEGREE, the polynomial degree of exactness of
//    the rule.
//
{
  int degree;

  if ( rule == 1 )
  {
    degree = 3;
  }
  else if ( rule == 2 )
  {
    degree = 6;
  }
  else if ( rule == 3 )
  {
    degree = 9;
  }
  else if ( rule == 4 )
  {
    degree = 12;
  }
  else if ( rule == 5 )
  {
    degree = 12;
  }
  else if ( rule == 6 )
  {
    degree = 15;
  }
  else if ( rule == 7 )
  {
    degree = 18;
  }
  else
  {
    degree = -1;
    std::cout << "\n";
    std::cout << "FEKETE_DEGREE - Fatal error!\n";
    std::cout << "  Illegal RULE = " << rule << "\n";
    exit ( 1 );
  }

  return degree;
}